

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  ExternalKind EVar1;
  bool bVar2;
  pointer pEVar3;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_68;
  Enum local_60;
  Enum local_5c;
  int local_58;
  Enum local_54;
  Location local_50;
  undefined1 local_30 [8];
  __single_object field;
  ExternalKind kind_local;
  ModuleFieldList *fields_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_ = kind;
  while( true ) {
    bVar2 = PeekMatchLpar(this,Export);
    if (!bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    field._M_t.
    super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
    .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._0_4_ = Expect(this,Lpar);
    bVar2 = Failed(field._M_t.
                   super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._0_4_);
    if (bVar2) break;
    GetLocation(&local_50,this);
    std::make_unique<wabt::ExportModuleField,wabt::Location>((Location *)local_30);
    EVar1 = field._M_t.
            super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
            .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
    pEVar3 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
             ::operator->((unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                           *)local_30);
    (pEVar3->export_).kind = EVar1;
    local_54 = (Enum)Expect(this,Export);
    bVar2 = Failed((Result)local_54);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_58 = 1;
    }
    else {
      pEVar3 = std::
               unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
               operator->((unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                           *)local_30);
      local_5c = (Enum)ParseQuotedText(this,&(pEVar3->export_).name,true);
      bVar2 = Failed((Result)local_5c);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_58 = 1;
      }
      else {
        local_60 = (Enum)Expect(this,Rpar);
        bVar2 = Failed((Result)local_60);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_58 = 1;
        }
        else {
          std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
          unique_ptr<wabt::ExportModuleField,std::default_delete<wabt::ExportModuleField>,void>
                    ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)
                     &local_68,
                     (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)local_30);
          intrusive_list<wabt::ModuleField>::push_back(fields,&local_68);
          std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
                    (&local_68);
          local_58 = 0;
        }
      }
    }
    std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
    ~unique_ptr((unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                 *)local_30);
    if (local_58 != 0) {
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = std::make_unique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}